

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiDockContextPruneNodeData * __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Add(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  int *piVar1;
  int iVar2;
  ImGuiDockContextPruneNodeData *pIVar3;
  int iVar4;
  ImGuiDockContextPruneNodeData *__dest;
  int iVar5;
  int iVar6;
  
  iVar2 = this->FreeIdx;
  iVar4 = (this->Buf).Size;
  if (iVar2 == iVar4) {
    iVar5 = iVar2 + 1;
    iVar6 = (this->Buf).Capacity;
    iVar4 = iVar5;
    if (iVar6 <= iVar2) {
      if (iVar6 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar6 / 2 + iVar6;
      }
      if (iVar6 <= iVar5) {
        iVar6 = iVar5;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiDockContextPruneNodeData *)
               (*GImAllocatorAllocFunc)((long)iVar6 << 4,GImAllocatorUserData);
      pIVar3 = (this->Buf).Data;
      if (pIVar3 != (ImGuiDockContextPruneNodeData *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->Buf).Size << 4);
        pIVar3 = (this->Buf).Data;
        if ((pIVar3 != (ImGuiDockContextPruneNodeData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar6;
      iVar4 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar5;
  }
  else {
    if (iVar4 <= iVar2) goto LAB_001f32c5;
    iVar4 = (this->Buf).Data[iVar2].CountWindows;
  }
  this->FreeIdx = iVar4;
  pIVar3 = (this->Buf).Data + iVar2;
  pIVar3->CountWindows = 0;
  pIVar3->CountChildWindows = 0;
  pIVar3->CountChildNodes = 0;
  pIVar3->RootId = 0;
  if (iVar2 < (this->Buf).Size) {
    return (this->Buf).Data + iVar2;
  }
LAB_001f32c5:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                ,0x62f,
                "T &ImVector<ImGuiDockContextPruneNodeData>::operator[](int) [T = ImGuiDockContextPruneNodeData]"
               );
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }